

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# datafile.c
# Opt level: O2

int code_index_in_array(char **code_name,char *code)

{
  int iVar1;
  long lVar2;
  
  lVar2 = 0;
  while( true ) {
    if (code_name[lVar2] == (char *)0x0) {
      return -1;
    }
    iVar1 = strcmp(code_name[lVar2],code);
    if (iVar1 == 0) break;
    lVar2 = lVar2 + 1;
  }
  return (int)lVar2;
}

Assistant:

int code_index_in_array(const char *code_name[], const char *code)
{
	int i = 0;

	while (code_name[i]) {
		if (streq(code_name[i], code)) {
			return i;
		}
		i++;
	}

	return -1;
}